

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void duckdb_je_arena_postfork_child(tsdn_t *tsdn,arena_t *arena)

{
  tcache_slow_t *ptVar1;
  cache_bin_array_descriptor_t *pcVar2;
  tcache_t *ptVar3;
  arena_t *paVar4;
  arena_t *paVar5;
  ulong uVar6;
  arena_t *paVar7;
  szind_t i;
  ulong uVar8;
  
  arena->nthreads[0].repr = 0;
  arena->nthreads[1].repr = 0;
  if ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena == arena) {
    LOCK();
    arena->nthreads[0].repr = arena->nthreads[0].repr + 1;
    UNLOCK();
  }
  if ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_iarena == arena) {
    LOCK();
    arena->nthreads[1].repr = arena->nthreads[1].repr + 1;
    UNLOCK();
  }
  (arena->tcache_ql).qlh_first = (tcache_slow_t *)0x0;
  (arena->cache_bin_array_descriptor_ql).qlh_first = (cache_bin_array_descriptor_t *)0x0;
  if (((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true) &&
     ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow.arena == arena))
  {
    ptVar1 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow;
    ptVar3 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow.tcache;
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow.link.qre_next =
         ptVar1;
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow.link.qre_prev =
         ptVar1;
    (arena->tcache_ql).qlh_first = ptVar1;
    pcVar2 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow.
              cache_bin_array_descriptor;
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow.
    cache_bin_array_descriptor.link.qre_next = pcVar2;
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow.
    cache_bin_array_descriptor.link.qre_prev = pcVar2;
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow.
    cache_bin_array_descriptor.bins = ptVar3->bins;
    (arena->cache_bin_array_descriptor_ql).qlh_first = pcVar2;
  }
  uVar8 = 0;
  do {
    if (duckdb_je_bin_infos[uVar8].n_shards != 0) {
      uVar6 = 0;
      paVar5 = arena;
      paVar7 = arena;
      do {
        paVar4 = paVar5;
        if (uVar8 < duckdb_je_bin_info_nbatched_sizes) {
          paVar4 = paVar7;
        }
        duckdb_je_bin_postfork_child
                  (tsdn,(bin_t *)((long)&paVar4->nthreads[0].repr +
                                 (ulong)duckdb_je_arena_bin_offsets[uVar8]),
                   uVar8 < duckdb_je_bin_info_nbatched_sizes);
        uVar6 = uVar6 + 1;
        paVar7 = (arena_t *)&(paVar7->stats).mutex_prof_data[6].n_owner_switches;
        paVar5 = (arena_t *)&(paVar5->stats).mutex_prof_data[0].max_n_thds;
      } while (uVar6 < duckdb_je_bin_infos[uVar8].n_shards);
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 0x24);
  duckdb_je_malloc_mutex_postfork_child(tsdn,&arena->large_mtx);
  duckdb_je_base_postfork_child(tsdn,arena->base);
  duckdb_je_pa_shard_postfork_child(tsdn,&arena->pa_shard);
  duckdb_je_malloc_mutex_postfork_child(tsdn,&arena->tcache_ql_mtx);
  return;
}

Assistant:

void
arena_postfork_child(tsdn_t *tsdn, arena_t *arena) {
	atomic_store_u(&arena->nthreads[0], 0, ATOMIC_RELAXED);
	atomic_store_u(&arena->nthreads[1], 0, ATOMIC_RELAXED);
	if (tsd_arena_get(tsdn_tsd(tsdn)) == arena) {
		arena_nthreads_inc(arena, false);
	}
	if (tsd_iarena_get(tsdn_tsd(tsdn)) == arena) {
		arena_nthreads_inc(arena, true);
	}
	if (config_stats) {
		ql_new(&arena->tcache_ql);
		ql_new(&arena->cache_bin_array_descriptor_ql);
		tcache_slow_t *tcache_slow = tcache_slow_get(tsdn_tsd(tsdn));
		if (tcache_slow != NULL && tcache_slow->arena == arena) {
			tcache_t *tcache = tcache_slow->tcache;
			ql_elm_new(tcache_slow, link);
			ql_tail_insert(&arena->tcache_ql, tcache_slow, link);
			cache_bin_array_descriptor_init(
			    &tcache_slow->cache_bin_array_descriptor,
			    tcache->bins);
			ql_tail_insert(&arena->cache_bin_array_descriptor_ql,
			    &tcache_slow->cache_bin_array_descriptor, link);
		}
	}

	for (szind_t i = 0; i < SC_NBINS; i++) {
		for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
			bin_t *bin = arena_get_bin(arena, i, j);
			bin_postfork_child(tsdn, bin, arena_bin_has_batch(i));
		}
	}

	malloc_mutex_postfork_child(tsdn, &arena->large_mtx);
	base_postfork_child(tsdn, arena->base);
	pa_shard_postfork_child(tsdn, &arena->pa_shard);
	if (config_stats) {
		malloc_mutex_postfork_child(tsdn, &arena->tcache_ql_mtx);
	}
}